

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O0

bool sptk::ComputeLowerAndUpperBounds
               (double confidence_level,int num_data,vector<double,_std::allocator<double>_> *mean,
               vector<double,_std::allocator<double>_> *variance,
               vector<double,_std::allocator<double>_> *lower_bound,
               vector<double,_std::allocator<double>_> *upper_bound)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *pvVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  int in_EDI;
  vector<double,_std::allocator<double>_> *in_R8;
  double in_XMM0_Qa;
  double dVar9;
  double error;
  int i;
  double *u;
  double *l;
  int vector_length;
  double inverse_degrees_of_freedom;
  double t;
  int degrees_of_freedom;
  double *in_stack_000000e8;
  int in_stack_000000f4;
  double in_stack_000000f8;
  int local_6c;
  double local_48;
  
  if (((0.0 < in_XMM0_Qa) && (in_XMM0_Qa < 100.0)) && (0 < in_EDI)) {
    this = (vector<double,_std::allocator<double>_> *)
           std::vector<double,_std::allocator<double>_>::size(in_RSI);
    pvVar2 = (vector<double,_std::allocator<double>_> *)
             std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (((this == pvVar2) && (in_RCX != (vector<double,_std::allocator<double>_> *)0x0)) &&
       (in_R8 != (vector<double,_std::allocator<double>_> *)0x0)) {
      sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RCX);
      sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
      if (sVar3 != sVar4) {
        std::vector<double,_std::allocator<double>_>::size(in_RSI);
        std::vector<double,_std::allocator<double>_>::resize(this,sVar3);
      }
      sVar4 = std::vector<double,_std::allocator<double>_>::size(in_R8);
      sVar5 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
      if (sVar4 != sVar5) {
        std::vector<double,_std::allocator<double>_>::size(in_RSI);
        std::vector<double,_std::allocator<double>_>::resize(this,sVar3);
      }
      if (in_EDI + -1 == 0) {
        return false;
      }
      bVar1 = ComputePercentagePointOfTDistribution
                        (in_stack_000000f8,in_stack_000000f4,in_stack_000000e8);
      if (!bVar1) {
        return false;
      }
      sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,0);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,0);
      for (local_6c = 0; local_6c < (int)sVar3; local_6c = local_6c + 1) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_6c);
        dVar9 = sqrt(*pvVar8 * (1.0 / (double)(in_EDI + -1)));
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_6c);
        pvVar6[local_6c] = -local_48 * dVar9 + *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_6c);
        pvVar7[local_6c] = local_48 * dVar9 + *pvVar8;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ComputeLowerAndUpperBounds(double confidence_level, int num_data,
                                const std::vector<double>& mean,
                                const std::vector<double>& variance,
                                std::vector<double>* lower_bound,
                                std::vector<double>* upper_bound) {
  if (confidence_level <= 0.0 || 100.0 <= confidence_level || num_data <= 0 ||
      mean.size() != variance.size() || NULL == lower_bound ||
      NULL == upper_bound) {
    return false;
  }

  if (lower_bound->size() != mean.size()) {
    lower_bound->resize(mean.size());
  }
  if (upper_bound->size() != mean.size()) {
    upper_bound->resize(mean.size());
  }

  const int degrees_of_freedom(num_data - 1);
  if (0 == degrees_of_freedom) {
    return false;
  }

  double t;
  if (!sptk::ComputePercentagePointOfTDistribution(
          0.5 * (1.0 - confidence_level / 100.0), degrees_of_freedom, &t)) {
    return false;
  }

  const double inverse_degrees_of_freedom(1.0 / degrees_of_freedom);
  const int vector_length(static_cast<int>(mean.size()));
  double* l(&((*lower_bound)[0]));
  double* u(&((*upper_bound)[0]));
  for (int i(0); i < vector_length; ++i) {
    const double error(std::sqrt(variance[i] * inverse_degrees_of_freedom));
    l[i] = mean[i] - t * error;
    u[i] = mean[i] + t * error;
  }

  return true;
}